

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O0

Options * __thiscall
ApprovalTests::Options::withNamer(Options *this,shared_ptr<ApprovalTests::ApprovalNamer> *namer)

{
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_RDX;
  FileOptions *in_RSI;
  Options *in_RDI;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  FileOptions *in_stack_ffffffffffffff50;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_stack_ffffffffffffff58;
  shared_ptr<ApprovalTests::ApprovalNamer> *namer_00;
  undefined1 usingDefaultScrubber;
  Options *scrubber;
  Options *in_stack_ffffffffffffff80;
  
  scrubber = in_RDI;
  FileOptions::FileOptions
            (in_stack_ffffffffffffff50,
             (FileOptions *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  ::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(in_RDX,in_stack_ffffffffffffff58);
  usingDefaultScrubber = (undefined1)((ulong)in_RDX >> 0x38);
  namer_00 = (shared_ptr<ApprovalTests::ApprovalNamer> *)&stack0xffffffffffffff80;
  ::std::shared_ptr<ApprovalTests::ApprovalNamer>::shared_ptr
            (*(shared_ptr<ApprovalTests::ApprovalNamer> **)
              ((long)&in_RSI[1].fileExtensionWithDot_.field_2 + 8),
             (shared_ptr<ApprovalTests::ApprovalNamer> *)
             (ulong)CONCAT14((char)in_RSI[2].fileExtensionWithDot_._M_string_length,
                             in_stack_ffffffffffffff48));
  Options(in_stack_ffffffffffffff80,in_RSI,(Scrubber *)scrubber,(Reporter *)in_RDI,
          (bool)usingDefaultScrubber,namer_00);
  ::std::shared_ptr<ApprovalTests::ApprovalNamer>::~shared_ptr
            ((shared_ptr<ApprovalTests::ApprovalNamer> *)0x15f8ea);
  ::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)0x15f8f4);
  FileOptions::~FileOptions((FileOptions *)0x15f8fe);
  return scrubber;
}

Assistant:

Options Options::withNamer(std::shared_ptr<ApprovalNamer> namer)
    {
        return Options(
            fileOptions_, scrubber_, reporter_, usingDefaultScrubber_, std::move(namer));
    }